

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O0

void __thiscall imrt::EvaluationFunction::Zrollback(EvaluationFunction *this)

{
  bool bVar1;
  reference ppVar2;
  reference this_00;
  reference pvVar3;
  list<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  *in_RDI;
  int k;
  int o;
  pair<std::pair<int,_int>,_double> z;
  iterator __end1;
  iterator __begin1;
  list<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  *__range1;
  list<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  *in_stack_ffffffffffffffb8;
  double dVar4;
  int local_30;
  int iStack_2c;
  _Self local_20;
  _Self local_18;
  list<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  *local_10;
  
  local_10 = in_RDI + 0xf;
  local_18._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
       ::begin(in_stack_ffffffffffffffb8);
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
       ::end(in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppVar2 = std::_List_iterator<std::pair<std::pair<int,_int>,_double>_>::operator*
                       ((_List_iterator<std::pair<std::pair<int,_int>,_double>_> *)0x12f50b);
    dVar4 = ppVar2->second;
    local_30 = (ppVar2->first).first;
    iStack_2c = (ppVar2->first).second;
    this_00 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)&(in_RDI->
                               super__List_base<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
                               )._M_impl._M_node._M_size,(long)local_30);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)iStack_2c);
    *pvVar3 = *pvVar3 - dVar4;
    std::_List_iterator<std::pair<std::pair<int,_int>,_double>_>::operator++(&local_18);
  }
  std::__cxx11::
  list<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  ::clear(in_RDI);
  return;
}

Assistant:

void EvaluationFunction::Zrollback(){
	for(auto z:Z_diff){
		int o=z.first.first;
		int k=z.first.second;
		Z[o][k]-=z.second;
	}
	Z_diff.clear();
}